

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristic_spatial.h
# Opt level: O1

SpatialBinSplit<16UL> * __thiscall
embree::avx::SpatialBinInfo<16UL,_embree::PrimRef>::best
          (SpatialBinSplit<16UL> *__return_storage_ptr__,SpatialBinInfo<16UL,_embree::PrimRef> *this
          ,SpatialBinMapping<16UL> *mapping,size_t blocks_shift)

{
  float fVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  int iVar12;
  int iVar13;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *paVar14;
  ulong uVar15;
  int iVar16;
  long lVar17;
  int dim;
  long lVar18;
  ulong uVar19;
  float fVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [64];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  vfloat4 rAreas [16];
  vuint4 rCounts [16];
  undefined8 uStack_908;
  float afStack_900 [62];
  undefined1 auStack_808 [16];
  float afStack_7f8 [64];
  undefined1 auStack_6f8 [1120];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [7] [16];
  float afStack_1f8 [126];
  
  paVar14 = &this->bounds[0xf][2].upper.field_0;
  auVar21._8_4_ = 0x7f800000;
  auVar21._0_8_ = 0x7f8000007f800000;
  auVar21._12_4_ = 0x7f800000;
  auVar23._8_4_ = 0xff800000;
  auVar23._0_8_ = 0xff800000ff800000;
  auVar23._12_4_ = 0xff800000;
  auVar25 = ZEXT1664((undefined1  [16])0x0);
  lVar17 = 0x7f0;
  auVar27 = auVar23;
  auVar5 = auVar21;
  auVar4 = auVar23;
  auVar6 = auVar21;
  do {
    auVar7 = vpaddd_avx(auVar25._0_16_,
                        *(undefined1 (*) [16])((long)&this->bounds[0][0].lower.field_0 + lVar17));
    auVar25 = ZEXT1664(auVar7);
    *(undefined1 (*) [16])(auStack_808 + lVar17) = auVar7;
    auVar21 = vminps_avx(auVar21,(undefined1  [16])paVar14[-5]);
    auVar23 = vmaxps_avx(auVar23,(undefined1  [16])paVar14[-4]);
    auVar26 = vsubps_avx(auVar23,auVar21);
    auVar5 = vminps_avx(auVar5,(undefined1  [16])paVar14[-3]);
    auVar27 = vmaxps_avx(auVar27,(undefined1  [16])paVar14[-2]);
    auVar28 = vsubps_avx(auVar27,auVar5);
    auVar7 = vinsertps_avx(auVar28,auVar26,0x4c);
    auVar9 = vshufpd_avx(auVar26,auVar26,1);
    auVar9 = vinsertps_avx(auVar9,auVar28,0x9c);
    auVar26 = vunpcklps_avx(auVar26,auVar28);
    auVar28._0_4_ = auVar7._0_4_ * auVar9._0_4_ + (auVar7._0_4_ + auVar9._0_4_) * auVar26._0_4_;
    auVar28._4_4_ = auVar7._4_4_ * auVar9._4_4_ + (auVar7._4_4_ + auVar9._4_4_) * auVar26._4_4_;
    auVar28._8_4_ = auVar7._8_4_ * auVar9._8_4_ + (auVar7._8_4_ + auVar9._8_4_) * auVar26._8_4_;
    auVar28._12_4_ =
         auVar7._12_4_ * auVar9._12_4_ + (auVar7._12_4_ + auVar9._12_4_) * auVar26._12_4_;
    uVar2 = vmovlps_avx(auVar28);
    *(undefined8 *)((long)&uStack_908 + lVar17) = uVar2;
    auVar6 = vminps_avx(auVar6,(undefined1  [16])paVar14[-1]);
    auVar4 = vmaxps_avx(auVar4,(undefined1  [16])*paVar14);
    auVar26 = vsubps_avx(auVar4,auVar6);
    auVar7 = vmovshdup_avx(auVar26);
    auVar9 = vshufpd_avx(auVar26,auVar26,1);
    *(float *)((long)afStack_900 + lVar17) =
         auVar7._0_4_ * auVar9._0_4_ + (auVar7._0_4_ + auVar9._0_4_) * auVar26._0_4_;
    *(undefined4 *)((long)afStack_900 + lVar17 + 4) = 0;
    lVar17 = lVar17 + -0x10;
    paVar14 = paVar14 + -6;
  } while (lVar17 != 0x700);
  uVar15 = 0xffffffff;
  auVar9 = vpshufd_avx(ZEXT416((uint)~(-1 << ((byte)blocks_shift & 0x1f))),0);
  local_268[0]._8_4_ = 0x7f800000;
  local_268[0]._0_8_ = 0x7f8000007f800000;
  local_268[0]._12_4_ = 0x7f800000;
  auVar7 = (undefined1  [16])0x0;
  local_298 = (undefined1  [16])0x0;
  local_278 = (undefined1  [16])0x0;
  local_288 = (undefined1  [16])0x0;
  auVar26._8_8_ = 0x100000001;
  auVar26._0_8_ = 0x100000001;
  auVar27._8_4_ = 0xff800000;
  auVar27._0_8_ = 0xff800000ff800000;
  auVar27._12_4_ = 0xff800000;
  lVar17 = 0x50;
  lVar18 = 0x600;
  local_298 = (undefined1  [16])0x0;
  local_278 = ZEXT816(0) << 0x40;
  local_288 = ZEXT816(0) << 0x20;
  auVar30._8_4_ = 0x7fffffff;
  auVar30._0_8_ = 0x7fffffff7fffffff;
  auVar30._12_4_ = 0x7fffffff;
  auVar23 = auVar27;
  auVar21 = local_268[0];
  auVar4 = auVar27;
  auVar5 = local_268[0];
  auVar6 = local_268[0];
  do {
    local_268[0] = vminps_avx(local_268[0],
                              *(undefined1 (*) [16])((long)(this->bounds + -1) + 0x10 + lVar17));
    auVar27 = vmaxps_avx(auVar27,*(undefined1 (*) [16])((long)(this->bounds + -1) + 0x20 + lVar17));
    auVar24 = vsubps_avx(auVar27,local_268[0]);
    auVar21 = vminps_avx(auVar21,*(undefined1 (*) [16])((long)(this->bounds + -1) + 0x30 + lVar17));
    auVar23 = vmaxps_avx(auVar23,*(undefined1 (*) [16])((long)(this->bounds + -1) + 0x40 + lVar17));
    auVar5 = vminps_avx(auVar5,*(undefined1 (*) [16])((long)(this->bounds + -1) + 0x50 + lVar17));
    auVar4 = vmaxps_avx(auVar4,*(undefined1 (*) [16])
                                ((long)&this->bounds[0][0].lower.field_0 + lVar17));
    auVar10 = vsubps_avx(auVar23,auVar21);
    auVar11 = vsubps_avx(auVar4,auVar5);
    auVar28 = vshufps_avx(auVar24,auVar11,0x65);
    auVar28 = vblendps_avx(auVar28,auVar10,2);
    auVar29 = vshufps_avx(auVar24,auVar11,0x96);
    auVar3 = vinsertps_avx(auVar29,auVar10,0x90);
    auVar7 = vpaddd_avx(auVar7,*(undefined1 (*) [16])
                                ((long)&this->bounds[0][0].lower.field_0 + lVar18));
    auVar29 = vshufps_avx(auVar24,auVar11,0);
    auVar10 = vinsertps_avx(auVar29,auVar10,0x10);
    auVar29 = vpaddd_avx(auVar7,auVar9);
    auVar24 = vpsrld_avx(auVar29,ZEXT416((uint)blocks_shift));
    auVar29 = vpaddd_avx(auVar9,*(undefined1 (*) [16])(auStack_6f8 + lVar18));
    auVar22 = vpsrld_avx(auVar29,ZEXT416((uint)blocks_shift));
    auVar29 = vpsrad_avx(auVar24,0x1f);
    auVar8._8_8_ = 0x4f0000004f000000;
    auVar8._0_8_ = 0x4f0000004f000000;
    auVar11 = vpand_avx(auVar8,auVar29);
    auVar29 = vpand_avx(auVar30,auVar24);
    auVar29 = vcvtdq2ps_avx(auVar29);
    auVar24 = vpsrad_avx(auVar22,0x1f);
    auVar8 = vpand_avx(auVar8,auVar24);
    auVar24 = vpand_avx(auVar30,auVar22);
    auVar24 = vcvtdq2ps_avx(auVar24);
    auVar22._0_4_ =
         (auVar10._0_4_ * (auVar28._0_4_ + auVar3._0_4_) + auVar28._0_4_ * auVar3._0_4_) *
         (auVar29._0_4_ + auVar11._0_4_) +
         (auVar24._0_4_ + auVar8._0_4_) * *(float *)((long)afStack_7f8 + lVar18);
    auVar22._4_4_ =
         (auVar10._4_4_ * (auVar28._4_4_ + auVar3._4_4_) + auVar28._4_4_ * auVar3._4_4_) *
         (auVar29._4_4_ + auVar11._4_4_) +
         (auVar24._4_4_ + auVar8._4_4_) * *(float *)((long)afStack_7f8 + lVar18 + 4);
    auVar22._8_4_ =
         (auVar10._8_4_ * (auVar28._8_4_ + auVar3._8_4_) + auVar28._8_4_ * auVar3._8_4_) *
         (auVar29._8_4_ + auVar11._8_4_) +
         (auVar24._8_4_ + auVar8._8_4_) * *(float *)((long)afStack_7f8 + lVar18 + 8);
    auVar22._12_4_ =
         (auVar10._12_4_ * (auVar28._12_4_ + auVar3._12_4_) + auVar28._12_4_ * auVar3._12_4_) *
         (auVar29._12_4_ + auVar11._12_4_) +
         (auVar24._12_4_ + auVar8._12_4_) * *(float *)((long)afStack_7f8 + lVar18 + 0xc);
    auVar28 = vcmpps_avx(auVar22,auVar6,1);
    auVar6 = vminps_avx(auVar22,auVar6);
    local_288 = vblendvps_avx(local_288,*(undefined1 (*) [16])(auStack_6f8 + lVar18),auVar28);
    local_298 = vblendvps_avx(local_298,auVar26,auVar28);
    local_278 = vblendvps_avx(local_278,auVar7,auVar28);
    auVar26 = vpsubd_avx(auVar26,_DAT_01febe20);
    lVar17 = lVar17 + 0x60;
    lVar18 = lVar18 + 0x10;
  } while (lVar17 != 0x5f0);
  local_268[0] = auVar6;
  fVar20 = INFINITY;
  uVar19 = 0;
  iVar12 = 0;
  iVar13 = 0;
  iVar16 = 0;
  do {
    fVar1 = (mapping->scale).field_0.v[uVar19];
    if ((((fVar1 != 0.0) || (NAN(fVar1))) && (afStack_1f8[uVar19 - 0x1c] < fVar20)) &&
       (*(int *)(local_298 + uVar19 * 4) != 0)) {
      iVar13 = *(int *)(local_278 + uVar19 * 4);
      iVar12 = *(int *)(local_288 + uVar19 * 4);
      uVar15 = uVar19 & 0xffffffff;
      iVar16 = *(int *)(local_298 + uVar19 * 4);
      fVar20 = afStack_1f8[uVar19 - 0x1c];
    }
    uVar19 = uVar19 + 1;
  } while (uVar19 != 3);
  if ((int)uVar15 == -1) {
    fVar20 = INFINITY;
    iVar12 = -1;
    iVar13 = -1;
    iVar16 = 0;
  }
  __return_storage_ptr__->sah = fVar20;
  __return_storage_ptr__->dim = (int)uVar15;
  __return_storage_ptr__->pos = iVar16;
  __return_storage_ptr__->left = iVar13;
  __return_storage_ptr__->right = iVar12;
  __return_storage_ptr__->factor = 1.0;
  uVar2 = *(undefined8 *)((long)&(mapping->ofs).field_0 + 8);
  *(undefined8 *)&(__return_storage_ptr__->mapping).ofs.field_0 =
       *(undefined8 *)&(mapping->ofs).field_0;
  *(undefined8 *)((long)&(__return_storage_ptr__->mapping).ofs.field_0 + 8) = uVar2;
  uVar2 = *(undefined8 *)((long)&(mapping->scale).field_0 + 8);
  *(undefined8 *)&(__return_storage_ptr__->mapping).scale.field_0 =
       *(undefined8 *)&(mapping->scale).field_0;
  *(undefined8 *)((long)&(__return_storage_ptr__->mapping).scale.field_0 + 8) = uVar2;
  uVar2 = *(undefined8 *)((long)&(mapping->inv_scale).field_0 + 8);
  *(undefined8 *)&(__return_storage_ptr__->mapping).inv_scale.field_0 =
       *(undefined8 *)&(mapping->inv_scale).field_0;
  *(undefined8 *)((long)&(__return_storage_ptr__->mapping).inv_scale.field_0 + 8) = uVar2;
  return __return_storage_ptr__;
}

Assistant:

SpatialBinSplit<BINS> best(const SpatialBinMapping<BINS>& mapping, const size_t blocks_shift) const 
      {
        /* sweep from right to left and compute parallel prefix of merged bounds */
        vfloat4 rAreas[BINS];
        vuint4 rCounts[BINS];
        vuint4 count = 0; BBox3fa bx = empty; BBox3fa by = empty; BBox3fa bz = empty;
        for (size_t i=BINS-1; i>0; i--)
        {
          count += numEnd[i];
          rCounts[i] = count;
          bx.extend(bounds[i][0]); rAreas[i][0] = halfArea(bx);
          by.extend(bounds[i][1]); rAreas[i][1] = halfArea(by);
          bz.extend(bounds[i][2]); rAreas[i][2] = halfArea(bz);
          rAreas[i][3] = 0.0f;
        }
        
        /* sweep from left to right and compute SAH */
        vuint4 blocks_add = (1 << blocks_shift)-1;
        vuint4 ii = 1; vfloat4 vbestSAH = pos_inf; vuint4 vbestPos = 0; vuint4 vbestlCount = 0; vuint4 vbestrCount = 0;
        count = 0; bx = empty; by = empty; bz = empty;
        for (size_t i=1; i<BINS; i++, ii+=1)
        {
          count += numBegin[i-1];
          bx.extend(bounds[i-1][0]); float Ax = halfArea(bx);
          by.extend(bounds[i-1][1]); float Ay = halfArea(by);
          bz.extend(bounds[i-1][2]); float Az = halfArea(bz);
          const vfloat4 lArea = vfloat4(Ax,Ay,Az,Az);
          const vfloat4 rArea = rAreas[i];
          const vuint4 lCount = (count     +blocks_add) >> (unsigned int)(blocks_shift);
          const vuint4 rCount = (rCounts[i]+blocks_add) >> (unsigned int)(blocks_shift);
          const vfloat4 sah = madd(lArea,vfloat4(lCount),rArea*vfloat4(rCount));
          // const vfloat4 sah = madd(lArea,vfloat4(vint4(lCount)),rArea*vfloat4(vint4(rCount)));
          const vbool4 mask = sah < vbestSAH;
          vbestPos      = select(mask,ii ,vbestPos);
          vbestSAH      = select(mask,sah,vbestSAH);
          vbestlCount   = select(mask,count,vbestlCount);
          vbestrCount   = select(mask,rCounts[i],vbestrCount);
        }
        
        /* find best dimension */
        float bestSAH = inf;
        int   bestDim = -1;
        int   bestPos = 0;
        unsigned int   bestlCount = 0;
        unsigned int   bestrCount = 0;
        for (int dim=0; dim<3; dim++) 
        {
          /* ignore zero sized dimensions */
          if (unlikely(mapping.invalid(dim)))
            continue;
          
          /* test if this is a better dimension */
          if (vbestSAH[dim] < bestSAH && vbestPos[dim] != 0) {
            bestDim = dim;
            bestPos = vbestPos[dim];
            bestSAH = vbestSAH[dim];
            bestlCount = vbestlCount[dim];
            bestrCount = vbestrCount[dim];
          }
        }
        assert(bestSAH >= 0.0f);
        
        /* return invalid split if no split found */
        if (bestDim == -1) 
          return SpatialBinSplit<BINS>(inf,-1,0,mapping);
        
        /* return best found split */
        return SpatialBinSplit<BINS>(bestSAH,bestDim,bestPos,bestlCount,bestrCount,1.0f,mapping);
      }